

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int iVar1;
  ostream *poVar2;
  internal *piVar3;
  TestResult *this;
  TestCase *pTVar4;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int local_2d0;
  allocator local_2c9;
  int i;
  allocator local_2a1;
  string local_2a0;
  string local_280;
  int local_25c;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  int local_12c;
  string local_128;
  allocator local_101;
  string local_100;
  int local_dc;
  string local_d8;
  allocator local_b1;
  string local_b0;
  int local_8c;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  UnitTest *unit_test_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = unit_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(stream,"<");
  std::operator<<(poVar2,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"tests",&local_61);
  local_8c = UnitTest::reportable_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_88,&local_8c);
  OutputXmlAttribute(stream,(string *)local_38,&local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"failures",&local_b1);
  local_dc = UnitTest::failed_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_d8,&local_dc);
  OutputXmlAttribute(stream,(string *)local_38,&local_b0,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"disabled",&local_101);
  local_12c = UnitTest::reportable_disabled_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_128,&local_12c);
  OutputXmlAttribute(stream,(string *)local_38,&local_100,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"errors",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"0",&local_179);
  OutputXmlAttribute(stream,(string *)local_38,&local_150,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"timestamp",&local_1a1);
  piVar3 = (internal *)UnitTest::start_timestamp((UnitTest *)kTestsuites.field_2._8_8_);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_1c8,piVar3,ms);
  OutputXmlAttribute(stream,(string *)local_38,&local_1a0,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"time",&local_1e9);
  piVar3 = (internal *)UnitTest::elapsed_time((UnitTest *)kTestsuites.field_2._8_8_);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_210,piVar3,ms_00);
  OutputXmlAttribute(stream,(string *)local_38,&local_1e8,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"random_seed",&local_231);
    local_25c = UnitTest::random_seed((UnitTest *)kTestsuites.field_2._8_8_);
    StreamableToString<int>(&local_258,&local_25c);
    OutputXmlAttribute(stream,(string *)local_38,&local_230,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  this = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  TestPropertiesAsXmlAttributes_abi_cxx11_(&local_280,(XmlUnitTestResultPrinter *)this,result);
  std::operator<<(stream,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"name",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"AllTests",&local_2c9);
  OutputXmlAttribute(stream,(string *)local_38,&local_2a0,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::operator<<(stream,">\n");
  local_2d0 = 0;
  while( true ) {
    iVar1 = UnitTest::total_test_case_count((UnitTest *)kTestsuites.field_2._8_8_);
    if (iVar1 <= local_2d0) break;
    pTVar4 = UnitTest::GetTestCase((UnitTest *)kTestsuites.field_2._8_8_,local_2d0);
    iVar1 = TestCase::reportable_test_count(pTVar4);
    if (0 < iVar1) {
      pTVar4 = UnitTest::GetTestCase((UnitTest *)kTestsuites.field_2._8_8_,local_2d0);
      PrintXmlTestCase(stream,pTVar4);
    }
    local_2d0 = local_2d0 + 1;
  }
  poVar2 = std::operator<<(stream,"</");
  poVar2 = std::operator<<(poVar2,(string *)local_38);
  std::operator<<(poVar2,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0)
      PrintXmlTestCase(stream, *unit_test.GetTestCase(i));
  }
  *stream << "</" << kTestsuites << ">\n";
}